

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall TableCommand::TableCommand(TableCommand *this,path *fileName,Encoding encoding)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_98;
  undefined4 local_74;
  string local_70;
  undefined1 local_50 [8];
  path fullName;
  Encoding encoding_local;
  path *fileName_local;
  TableCommand *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__TableCommand_002b2bf0;
  EncodingTable::EncodingTable(&this->table);
  getFullPathName((path *)local_50,fileName);
  bVar1 = ghc::filesystem::exists((path *)local_50);
  if (bVar1) {
    bVar1 = EncodingTable::load(&this->table,(path *)local_50,encoding);
    if (bVar1) {
      local_74 = 0;
    }
    else {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_98,fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x22ce95,(char *)&local_98,in_RCX);
      std::__cxx11::string::~string((string *)&local_98);
      local_74 = 1;
    }
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_70,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x1,0x22ce76,(char *)&local_70,in_RCX);
    std::__cxx11::string::~string((string *)&local_70);
    local_74 = 1;
  }
  ghc::filesystem::path::~path((path *)local_50);
  return;
}

Assistant:

TableCommand::TableCommand(const fs::path& fileName, TextFile::Encoding encoding)
{
	auto fullName = getFullPathName(fileName);

	if (!fs::exists(fullName))
	{
		Logger::printError(Logger::Error, "Table file \"%s\" does not exist", fileName.u8string());
		return;
	}

	if (!table.load(fullName,encoding))
	{
		Logger::printError(Logger::Error, "Invalid table file \"%s\"",fileName.u8string());
		return;
	}
}